

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall OpenMD::EAMAdapter::getOF(EAMAdapter *this)

{
  ZhouParameters *in_RDI;
  ZhouParameters zhouParam;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff08;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff10;
  EAMAdapter *in_stack_ffffffffffffff88;
  
  getZhouParam(in_stack_ffffffffffffff88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ZhouParameters::~ZhouParameters(in_RDI);
  return (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::vector<RealType>> EAMAdapter::getOF() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.OF;
  }